

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O2

void test_json_class_exceptions(void)

{
  bool bVar1;
  string *psVar2;
  allocator local_179;
  json j_14;
  json j;
  json r2;
  string local_70;
  string local_50 [32];
  string local_30 [32];
  
  argo::json::json(&j,100);
  std::operator<<((ostream *)jlog,"FAIL: construct invalid type failed to throw exception\n");
  argo::json::~json(&j);
  std::__cxx11::string::string((string *)&j_14,"asdadasd",(allocator *)&r2);
  argo::json::json(&j,array_e,(string *)&j_14);
  std::__cxx11::string::~string((string *)&j_14);
  std::operator<<((ostream *)jlog,
                  "FAIL: construct invalid type with raw value failed to throw exception\n");
  argo::json::~json(&j);
  std::__cxx11::string::string((string *)&j_14,"100",(allocator *)&r2);
  argo::json::json(&j,number_int_e,(string *)&j_14);
  std::__cxx11::string::~string((string *)&j_14);
  argo::json::operator_cast_to_int(&j);
  std::operator<<((ostream *)jlog,"FAIL: cast raw to int failed to throw exception\n");
  argo::json::~json(&j);
  argo::json::json(&j,"100");
  argo::json::operator_cast_to_int(&j);
  std::operator<<((ostream *)jlog,"FAIL: cast string to int failed to throw exception\n");
  argo::json::~json(&j);
  std::__cxx11::string::string((string *)&j_14,"100",(allocator *)&r2);
  argo::json::json(&j,number_double_e,(string *)&j_14);
  std::__cxx11::string::~string((string *)&j_14);
  argo::json::operator_cast_to_double(&j);
  std::operator<<((ostream *)jlog,"FAIL: cast raw double to double failed to throw exception\n");
  argo::json::~json(&j);
  argo::json::json(&j,"100");
  argo::json::operator_cast_to_double(&j);
  std::operator<<((ostream *)jlog,"FAIL: cast string to double failed to throw exception\n");
  argo::json::~json(&j);
  std::__cxx11::string::string((string *)&j_14,"100",(allocator *)&r2);
  argo::json::json(&j,string_e,(string *)&j_14);
  std::__cxx11::string::~string((string *)&j_14);
  psVar2 = argo::json::operator_cast_to_string_(&j);
  std::__cxx11::string::string(local_30,(string *)psVar2);
  std::__cxx11::string::~string(local_30);
  std::operator<<((ostream *)jlog,"FAIL: cast raw string to string failed to throw exception\n");
  argo::json::~json(&j);
  argo::json::json(&j,100);
  psVar2 = argo::json::operator_cast_to_string_(&j);
  std::__cxx11::string::string(local_50,(string *)psVar2);
  std::__cxx11::string::~string(local_50);
  std::operator<<((ostream *)jlog,"FAIL: cast int to string failed to throw exception\n");
  argo::json::~json(&j);
  argo::json::json(&j,"asdasd");
  argo::json::operator_cast_to_bool(&j);
  std::operator<<((ostream *)jlog,"FAIL: cast string to bool failed to throw exception\n");
  argo::json::~json(&j);
  argo::json::json(&j,"asdasd");
  argo::json::operator[](&j,"asdasd");
  std::operator<<((ostream *)jlog,
                  "FAIL: attempt to access string via [\"name\"] failed to throw exception\n");
  argo::json::~json(&j);
  argo::json::json(&j,"asdasd");
  argo::json::operator[](&j,1);
  std::operator<<((ostream *)jlog,
                  "FAIL: attempt to access string via [1] failed to throw exception\n");
  argo::json::~json(&j);
  argo::json::json(&j,array_e);
  argo::json::operator[](&j,1);
  std::operator<<((ostream *)jlog,
                  "FAIL: attempt to access item 1 of zero length array failed to throw exception\n")
  ;
  argo::json::~json(&j);
  argo::json::json(&j,array_e);
  argo::json::operator[](&j,-1);
  std::operator<<((ostream *)jlog,
                  "FAIL: attempt to access item -1 of zero length array failed to throw exception\n"
                 );
  argo::json::~json(&j);
  argo::json::json(&j,object_e);
  test_const_exception(&j);
  argo::json::json(&j_14,1);
  argo::json::json(&r2,1);
  argo::json::append(&j_14,&r2);
  argo::json::~json(&r2);
  std::operator<<((ostream *)jlog,"FAIL: attempt to append to non-array failed to throw exception\n"
                 );
  argo::json::~json(&j_14);
  argo::json::json(&j_14,1);
  std::__cxx11::string::string((string *)&local_70,"asdasd",&local_179);
  argo::json::json(&r2,1);
  argo::json::insert(&j_14,&local_70,&r2);
  argo::json::~json(&r2);
  std::__cxx11::string::~string((string *)&local_70);
  std::operator<<((ostream *)jlog,"FAIL: attempt insert into non-object failed to throw exception\n"
                 );
  argo::json::~json(&j_14);
  std::__cxx11::string::string((string *)&r2,"123",(allocator *)&local_70);
  argo::json::json(&j_14,number_int_e,(string *)&r2);
  std::__cxx11::string::~string((string *)&r2);
  std::__cxx11::string::string((string *)&local_70,"123",&local_179);
  argo::json::json(&r2,number_int_e,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  bVar1 = argo::json::operator==(&j_14,&r2);
  if (bVar1) {
    std::operator<<((ostream *)jlog,"PASS: attempt to compare raw ints failed to throw exception\n")
    ;
  }
  argo::json::~json(&r2);
  argo::json::~json(&j_14);
  std::__cxx11::string::string((string *)&r2,"123",(allocator *)&local_70);
  argo::json::json(&j_14,number_int_e,(string *)&r2);
  std::__cxx11::string::~string((string *)&r2);
  bVar1 = argo::json::operator==(&j_14,0x7b);
  if (bVar1) {
    std::operator<<((ostream *)jlog,
                    "FAIL: attempt to compare raw int to int failed to throw exception\n");
  }
  argo::json::~json(&j_14);
  std::__cxx11::string::string((string *)&r2,"123",(allocator *)&local_70);
  argo::json::json(&j_14,string_e,(string *)&r2);
  std::__cxx11::string::~string((string *)&r2);
  std::__cxx11::string::string((string *)&local_70,"123",&local_179);
  argo::json::json(&r2,string_e,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  bVar1 = argo::json::operator==(&j_14,&r2);
  if (bVar1) {
    std::operator<<((ostream *)jlog,
                    "FAIL: attempt to compare raw strings failed to throw exception\n");
  }
  argo::json::~json(&r2);
  argo::json::~json(&j_14);
  std::__cxx11::string::string((string *)&r2,"123",(allocator *)&local_70);
  argo::json::json(&j_14,string_e,(string *)&r2);
  std::__cxx11::string::~string((string *)&r2);
  bVar1 = argo::json::operator==(&j_14,"123");
  if (bVar1) {
    std::operator<<((ostream *)jlog,
                    "FAIL: attempt to compare raw strings failed to throw exception\n");
  }
  argo::json::~json(&j_14);
  argo::json::json(&j_14,100);
  argo::json::json(&r2,"asdasd");
  argo::json::operator<(&j_14,&r2);
  std::operator<<((ostream *)jlog,"FAIL: < compare incomparable types failed to throw exception\n");
  argo::json::~json(&r2);
  argo::json::~json(&j_14);
  argo::json::json(&j_14,100);
  argo::json::json(&r2,"asdasd");
  argo::json::operator<=(&j_14,&r2);
  std::operator<<((ostream *)jlog,"FAIL: <= compare incomparable types failed to throw exception\n")
  ;
  argo::json::~json(&r2);
  argo::json::~json(&j_14);
  argo::json::json(&j_14,100);
  argo::json::json(&r2,"asdasd");
  argo::json::operator>(&j_14,&r2);
  std::operator<<((ostream *)jlog,"FAIL: > compare incomparable types failed to throw exception\n");
  argo::json::~json(&r2);
  argo::json::~json(&j_14);
  argo::json::json(&j_14,100);
  argo::json::json(&r2,"asdasd");
  argo::json::operator<=(&j_14,&r2);
  std::operator<<((ostream *)jlog,"FAIL: >= compare incomparable types failed to throw exception\n")
  ;
  argo::json::~json(&r2);
  argo::json::~json(&j_14);
  argo::json::~json(&j);
  return;
}

Assistant:

void test_json_class_exceptions()
{
    try
    {
        json j(static_cast<json::type>(100));
        jlog << "FAIL: construct invalid type failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::invalid_json_type_e)
        {
            jlog << "FAIL: construct invalid type threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: construct invalid type threw correct exception type\n";
        }
    }

    try
    {
        json j(json::array_e, "asdadasd");
        jlog << "FAIL: construct invalid type with raw value failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_number_or_string_e)
        {
            jlog << "FAIL: construct invalid type with raw value threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: construct invalid type with raw value threw correct exception type\n";
        }
    }

    try
    {
        json j(json::number_int_e, "100");
        (void)static_cast<int>(j);
        jlog << "FAIL: cast raw to int failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::cant_cast_raw_e)
        {
            jlog << "FAIL: cast raw to int threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: cast raw to int threw correct exception type\n";
        }
    }

    try
    {
        json j("100");
        (void)static_cast<int>(j);
        jlog << "FAIL: cast string to int failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_number_e)
        {
            jlog << "FAIL: cast string to int threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: cast string to int threw correct exception type\n";
        }
    }

    try
    {
        json j(json::number_double_e, "100");
        (void)static_cast<double>(j);
        jlog << "FAIL: cast raw double to double failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::cant_cast_raw_e)
        {
            jlog << "FAIL: cast raw double to double threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: cast raw double to double threw correct exception type\n";
        }
    }

    try
    {
        json j("100");
        (void)static_cast<double>(j);
        jlog << "FAIL: cast string to double failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_number_e)
        {
            jlog << "FAIL: cast string to double threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: cast string to double threw correct exception type\n";
        }
    }

    try
    {
        json j(json::string_e, "100");
        (void)static_cast<string>(j);
        jlog << "FAIL: cast raw string to string failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::cant_cast_raw_e)
        {
            jlog << "FAIL: cast raw string to string threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: cast raw string to string threw correct exception type\n";
        }
    }

    try
    {
        json j(100);
        (void)static_cast<string>(j);
        jlog << "FAIL: cast int to string failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_string_e)
        {
            jlog << "FAIL: cast int to string threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: cast int to string threw correct exception type\n";
        }
    }

    try
    {
        json j("asdasd");
        (void)static_cast<bool>(j);
        jlog << "FAIL: cast string to bool failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_number_int_or_boolean_e)
        {
            jlog << "FAIL: cast string to bool threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: cast string to bool threw correct exception type\n";
        }
    }

    try
    {
        json j("asdasd");
        (void)j["asdasd"];
        jlog << "FAIL: attempt to access string via [\"name\"] failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_an_object_e)
        {
            jlog << "FAIL: access string via [\"name\"] threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: access string via [\"name\"] threw correct exception type\n";
        }
    }

    try
    {
        json j("asdasd");
        (void)j[1];
        jlog << "FAIL: attempt to access string via [1] failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_an_array_e)
        {
            jlog << "FAIL: access string via [1] threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: access string via [1] threw correct exception type\n";
        }
    }

    try
    {
        json j(json::array_e);
        (void)j[1];
        jlog << "FAIL: attempt to access item 1 of zero length array failed to throw exception\n";
    }
    catch (json_array_index_range_exception &e)
    {
        if (e.get_type() != json_exception::array_index_range_e)
        {
            jlog << "FAIL: access empty array via [1] threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: access empty array via [1] threw correct exception type\n";
        }
    }

    try
    {
        json j(json::array_e);
        (void)j[-1];
        jlog << "FAIL: attempt to access item -1 of zero length array failed to throw exception\n";
    }
    catch (json_array_index_range_exception &e)
    {
        if (e.get_type() != json_exception::array_index_range_e)
        {
            jlog << "FAIL: access empty array via [-1] threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: access empty array via [-1] threw correct exception type\n";
        }
    }

    json j(json::object_e);
    test_const_exception(j);

    try
    {
        json j(1);
        j.append(json(1));
        jlog << "FAIL: attempt to append to non-array failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_an_array_e)
        {
            jlog << "FAIL: append to non-array threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: append to non-array threw correct exception type\n";
        }
    }

    try
    {
        json j(1);
        j.insert("asdasd", json(1));
        jlog << "FAIL: attempt insert into non-object failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::not_an_object_e)
        {
            jlog << "FAIL: insert into non-object threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: insert into non-object threw correct exception type\n";
        }
    }

    try
    {
        json r1(json::number_int_e, "123");
        json r2(json::number_int_e, "123");
        if (r1 == r2)
        {
            jlog << "PASS: attempt to compare raw ints failed to throw exception\n";
        }
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::cant_compare_raw_e)
        {
            jlog << "FAIL: compare raw ints threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: compare raw ints threw correct exception type\n";
        }
    }

    try
    {
        json r1(json::number_int_e, "123");
        if (r1 == 123)
        {
            jlog << "FAIL: attempt to compare raw int to int failed to throw exception\n";
        }
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::cant_cast_raw_e)
        {
            jlog << "FAIL: compare raw int with int threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: compare raw int with int threw correct exception type\n";
        }
    }

    try
    {
        json r1(json::string_e, "123");
        json r2(json::string_e, "123");
        if (r1 == r2)
        {
            jlog << "FAIL: attempt to compare raw strings failed to throw exception\n";
        }
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::cant_compare_raw_e)
        {
            jlog << "FAIL: compare raw strings threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: compare raw strings threw correct exception type\n";
        }
    }

    try
    {
        json r1(json::string_e, "123");
        if (r1 == "123")
        {
            jlog << "FAIL: attempt to compare raw strings failed to throw exception\n";
        }
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::cant_cast_raw_e)
        {
            jlog << "FAIL: compare raw strings threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: compare raw strings threw correct exception type\n";
        }
    }

    try
    {
        json j1(100);
        json j2("asdasd");
        if (j1 < j2) {};
        jlog << "FAIL: < compare incomparable types failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::types_not_comparable_e)
        {
            jlog << "FAIL: < compare incomparable types threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: < compare incomparable types threw correct exception type\n";
        }
    }

    try
    {
        json j1(100);
        json j2("asdasd");
        if (j1 <= j2) {};
        jlog << "FAIL: <= compare incomparable types failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::types_not_comparable_e)
        {
            jlog << "FAIL: <= compare incomparable types threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: <= compare incomparable types threw correct exception type\n";
        }
    }

    try
    {
        json j1(100);
        json j2("asdasd");
        if (j1 > j2) {};
        jlog << "FAIL: > compare incomparable types failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::types_not_comparable_e)
        {
            jlog << "FAIL: > compare incomparable types threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: > compare incomparable types threw correct exception type\n";
        }
    }

    try
    {
        json j1(100);
        json j2("asdasd");
        if (j1 <= j2) {};
        jlog << "FAIL: >= compare incomparable types failed to throw exception\n";
    }
    catch (json_exception &e)
    {
        if (e.get_type() != json_exception::types_not_comparable_e)
        {
            jlog << "FAIL: >= compare incomparable types threw wrong exception type\n";
            jlog << e.what() << endl;
        }
        else
        {
            jlog << "PASS: >= compare incomparable types threw correct exception type\n";
        }
    }
}